

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.hpp
# Opt level: O0

Option * __thiscall
CLI::App::add_option<std::__cxx11::string>
          (App *this,string *name,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *variable,string *description)

{
  Option *pOVar1;
  char *pcVar2;
  allocator local_e9;
  string local_e8;
  string local_c8;
  function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>)>
  local_a8;
  string local_78;
  Option *local_58;
  Option *opt;
  undefined1 local_48 [8];
  callback_t fun;
  string *description_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *variable_local;
  string *name_local;
  App *this_local;
  
  opt = (Option *)variable;
  fun._M_invoker = (_Invoker_type)description;
  ::std::function<bool(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>)>::
  function<CLI::App::add_option<std::__cxx11::string>(std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string)::_lambda(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>)_1_,void>
            ((function<bool(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>)>
              *)local_48,(anon_class_8_1_9d70f7fa *)&opt);
  ::std::__cxx11::string::string((string *)&local_78,(string *)name);
  std::
  function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>)>
  ::function(&local_a8,
             (function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>)>
              *)local_48);
  ::std::__cxx11::string::string((string *)&local_c8,(string *)description);
  pOVar1 = add_option(this,&local_78,&local_a8,&local_c8,false);
  ::std::__cxx11::string::~string((string *)&local_c8);
  std::
  function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>)>
  ::~function(&local_a8);
  ::std::__cxx11::string::~string((string *)&local_78);
  local_58 = pOVar1;
  pcVar2 = detail::
           type_name<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                     ();
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_e8,pcVar2,&local_e9);
  Option::set_custom_option(pOVar1,&local_e8,-1);
  ::std::__cxx11::string::~string((string *)&local_e8);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  pOVar1 = local_58;
  std::
  function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>)>
  ::~function((function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>)>
               *)local_48);
  return pOVar1;
}

Assistant:

Option *add_option(std::string name,
                       std::vector<T> &variable, ///< The variable vector to set
                       std::string description = "") {

        CLI::callback_t fun = [&variable](CLI::results_t res) {
            bool retval = true;
            variable.clear();
            for(const auto &a : res) {
                variable.emplace_back();
                retval &= detail::lexical_cast(a, variable.back());
            }
            return (!variable.empty()) && retval;
        };

        Option *opt = add_option(name, fun, description, false);
        opt->set_custom_option(detail::type_name<T>(), -1);
        return opt;
    }